

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_iforest.hpp
# Opt level: O0

int choose_cat_from_present<InputData<float,int>,WorkerMemory<ImputedData<int,double>,double,float>>
              (WorkerMemory<ImputedData<int,_double>,_double,_float> *workspace,
              InputData<float,_int> *input_data,size_t col_num)

{
  pointer st;
  pointer end;
  size_t n;
  bool bVar1;
  result_type_conflict rVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  reference pvVar3;
  unsigned_long *puVar4;
  double *counter;
  double *in_RDX;
  size_t in_RSI;
  size_type __n;
  size_t in_RDI;
  vector<signed_char,_std::allocator<signed_char>_> *this;
  double extraout_XMM0_Qa;
  double exp_remainder;
  double extraout_XMM0_Qa_00;
  int cat;
  size_t *in_stack_00000008;
  int chosen_cat;
  double *in_stack_ffffffffffffff50;
  double *in_stack_ffffffffffffff58;
  size_t in_stack_ffffffffffffff60;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff68;
  size_t in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffffd8;
  int iVar5;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  std::uniform_int_distribution<int>::uniform_int_distribution
            ((uniform_int_distribution<int> *)
             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc
             ,in_stack_ffffffffffffffd8);
  __n = in_RDI + 0x30;
  this = (vector<signed_char,_std::allocator<signed_char>_> *)&stack0xffffffffffffffdc;
  rVar2 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)
                     CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     (Xoshiro256PP *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  *(undefined4 *)(in_RDI + 0x158) = 0;
  iVar5 = 0;
  exp_remainder = extraout_XMM0_Qa;
  do {
    if (*(int *)(*(long *)(in_RSI + 0x18) + (long)in_RDX * 4) <= iVar5) {
      if (((ulong)this[9].super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage & 1) == 0) {
        puVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x4775e8);
        st = this[3].super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        end = this[4].super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
              super__Vector_impl_data._M_start;
        n = *(size_t *)(__n + 0x30);
        counter = std::vector<double,_std::allocator<double>_>::data
                            ((vector<double,_std::allocator<double>_> *)0x477631);
        increase_comb_counter(puVar4,(size_t)st,(size_t)end,n,counter,exp_remainder);
        iVar5 = extraout_EAX;
      }
      else {
        bVar1 = std::vector<double,_std::allocator<double>_>::empty(in_stack_ffffffffffffff68);
        if (bVar1) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x47771c);
          std::vector<double,_std::allocator<double>_>::data
                    ((vector<double,_std::allocator<double>_> *)0x477765);
          increase_comb_counter
                    (in_stack_00000008,_cat,in_RDI,in_RSI,in_RDX,
                     (robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                      *)CONCAT44(rVar2,in_stack_ffffffffffffffe0),
                     (double)CONCAT44(in_stack_ffffffffffffffdc,iVar5));
          iVar5 = extraout_EAX_01;
        }
        else {
          puVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x477681);
          std::vector<double,_std::allocator<double>_>::data
                    ((vector<double,_std::allocator<double>_> *)0x4776ca);
          std::vector<double,_std::allocator<double>_>::data
                    ((vector<double,_std::allocator<double>_> *)0x4776e3);
          increase_comb_counter
                    (puVar4,in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68,
                     in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                     2.31397127426685e-317);
          iVar5 = extraout_EAX_00;
        }
      }
      return iVar5;
    }
    this = (vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x138);
    __n = (size_type)iVar5;
    pvVar3 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[](this,__n);
    if ('\0' < *pvVar3) {
      if (*(int *)(in_RDI + 0x158) == rVar2) {
        return iVar5;
      }
      *(int *)(in_RDI + 0x158) = *(int *)(in_RDI + 0x158) + 1;
    }
    iVar5 = iVar5 + 1;
    exp_remainder = extraout_XMM0_Qa_00;
  } while( true );
}

Assistant:

int choose_cat_from_present(WorkerMemory &workspace, InputData &input_data, size_t col_num)
{
    int chosen_cat = std::uniform_int_distribution<int>
                                    (0, workspace.npresent - 1)
                                    (workspace.rnd_generator);
    workspace.ncat_tried = 0;
    for (int cat = 0; cat < input_data.ncat[col_num]; cat++)
    {
        if (workspace.categs[cat] > 0)
        {
            if (workspace.ncat_tried == chosen_cat)
                return cat;
            else
                workspace.ncat_tried++;
        }
    }

    unreachable();
    return -1; /* this will never be reached, but CRAN complains otherwise */
}